

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sls_8_pi7(void)

{
  uint address;
  uint value;
  
  address = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  value = 0;
  if (m68ki_cpu.not_z_flag == 0) {
    value = 0xff;
  }
  if (((ushort)m68ki_cpu.c_flag & 0x100) != 0) {
    value = 0xff;
  }
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_sls_8_pi7(void)
{
	m68ki_write_8(EA_A7_PI_8(), COND_LS() ? 0xff : 0);
}